

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O2

string * fs_normal_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  _Bool _Var1;
  bool bVar2;
  ulong uVar3;
  string_view path_00;
  path pStack_98;
  path local_70;
  string local_48;
  string_view path_local;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_70,&path_local,auto_format);
  std::filesystem::__cxx11::path::lexically_normal();
  std::filesystem::__cxx11::path::generic_string(&local_48,&pStack_98);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::filesystem::__cxx11::path::~path(&pStack_98);
  std::filesystem::__cxx11::path::~path(&local_70);
  uVar3 = __return_storage_ptr__->_M_string_length;
  if (uVar3 < 2) goto LAB_00109707;
  if ((__return_storage_ptr__->_M_dataplus)._M_p[uVar3 - 1] == '/') {
    _Var1 = fs_is_windows();
    if (_Var1) {
      path_00._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
      path_00._M_len = __return_storage_ptr__->_M_string_length;
      fs_root_abi_cxx11_(&pStack_98._M_pathname,path_00);
      bVar2 = std::operator!=(__return_storage_ptr__,&pStack_98._M_pathname);
      std::__cxx11::string::~string((string *)&pStack_98);
      if (!bVar2) goto LAB_00109703;
    }
    std::__cxx11::string::pop_back();
  }
LAB_00109703:
  uVar3 = __return_storage_ptr__->_M_string_length;
LAB_00109707:
  if (uVar3 == 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
fs_normal(std::string_view path)
{
  // normalize path
   std::string r;
#ifdef HAVE_CXX_FILESYSTEM
  r = std::filesystem::path(path).lexically_normal().generic_string();
#else
  // leave the empty short-circuit to avoid needless computation
  // and avoid indexing into an empty string
  if (path.empty())
    return ".";

  const std::vector<std::string> parts = fs_normal_vector(path);

  // rebuild path
   if (fs_slash_first(path))
     r.push_back('/');

  for (const auto& p : parts)
    r.append(p).push_back('/');

#endif

  // no trailing slash
  if (r.length() > 1 && r.back() == '/' && (!fs_is_windows() || r != fs_root(r)))
    r.pop_back();

  if (r.empty())
    r.push_back('.');

  return r;
}